

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O0

bool __thiscall pbrt::Barrier::Block(Barrier *this)

{
  int iVar1;
  char *in_RDI;
  int unaff_retaddr;
  char *in_stack_00000008;
  LogLevel in_stack_00000014;
  char (*in_stack_00000020) [11];
  int *in_stack_00000028;
  char (*in_stack_00000030) [2];
  int *in_stack_00000038;
  int vb;
  int va;
  unique_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff98;
  unique_lock<std::mutex> *in_stack_ffffffffffffffa0;
  condition_variable *in_stack_ffffffffffffffa8;
  anon_class_8_1_8991fb9c in_stack_ffffffffffffffb0;
  char (*in_stack_ffffffffffffffe8) [2];
  char (*in_stack_fffffffffffffff0) [11];
  char *fmt;
  
  fmt = in_RDI;
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  *(int *)(in_RDI + 0x58) = *(int *)(in_RDI + 0x58) + -1;
  if (*(int *)(in_RDI + 0x58) < 0) {
    LogFatal<char_const(&)[11],char_const(&)[2],char_const(&)[11],int&,char_const(&)[2],int&>
              (in_stack_00000014,in_stack_00000008,unaff_retaddr,fmt,in_stack_fffffffffffffff0,
               in_stack_ffffffffffffffe8,in_stack_00000020,in_stack_00000028,in_stack_00000030,
               in_stack_00000038);
  }
  if (*(int *)(in_RDI + 0x58) < 1) {
    std::condition_variable::notify_all();
  }
  else {
    std::condition_variable::wait<pbrt::Barrier::Block()::__0>
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffffb0);
  }
  iVar1 = *(int *)(in_RDI + 0x5c);
  *(int *)(in_RDI + 0x5c) = iVar1 + -1;
  std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffffa0);
  return iVar1 + -1 == 0;
}

Assistant:

bool Barrier::Block() {
    std::unique_lock<std::mutex> lock(mutex);

    --numToBlock;
    CHECK_GE(numToBlock, 0);

    if (numToBlock > 0) {
        cv.wait(lock, [this]() { return numToBlock == 0; });
    } else
        cv.notify_all();

    return --numToExit == 0;
}